

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void Catch::setOrder(ConfigData *config,string *order)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  _Alloc_hider _Var3;
  InWhatOrder IVar4;
  int iVar5;
  runtime_error *this;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"declared","");
  _Var3._M_p = local_68._M_dataplus._M_p;
  uVar2 = order->_M_string_length;
  if (local_68._M_string_length < uVar2) {
    bVar6 = false;
  }
  else if (uVar2 == 0) {
    bVar6 = true;
  }
  else {
    iVar5 = bcmp((order->_M_dataplus)._M_p,local_68._M_dataplus._M_p,uVar2);
    bVar6 = iVar5 == 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != paVar1) {
    operator_delete(_Var3._M_p);
  }
  IVar4 = InDeclarationOrder;
  if (!bVar6) {
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"lexical","");
    _Var3._M_p = local_68._M_dataplus._M_p;
    uVar2 = order->_M_string_length;
    if (local_68._M_string_length < uVar2) {
      bVar6 = false;
    }
    else if (uVar2 == 0) {
      bVar6 = true;
    }
    else {
      iVar5 = bcmp((order->_M_dataplus)._M_p,local_68._M_dataplus._M_p,uVar2);
      bVar6 = iVar5 == 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != paVar1) {
      operator_delete(_Var3._M_p);
    }
    IVar4 = InLexicographicalOrder;
    if (!bVar6) {
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"random","");
      _Var3._M_p = local_68._M_dataplus._M_p;
      uVar2 = order->_M_string_length;
      if (local_68._M_string_length < uVar2) {
        bVar6 = false;
      }
      else if (uVar2 == 0) {
        bVar6 = true;
      }
      else {
        iVar5 = bcmp((order->_M_dataplus)._M_p,local_68._M_dataplus._M_p,uVar2);
        bVar6 = iVar5 == 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var3._M_p != paVar1) {
        operator_delete(_Var3._M_p);
      }
      IVar4 = InRandomOrder;
      if (!bVar6) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_48,"Unrecognised ordering: \'",order);
        std::operator+(&local_68,&local_48,'\'');
        std::runtime_error::runtime_error(this,(string *)&local_68);
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  config->runOrder = IVar4;
  return;
}

Assistant:

inline void setOrder( ConfigData& config, std::string const& order ) {
        if( startsWith( "declared", order ) )
            config.runOrder = RunTests::InDeclarationOrder;
        else if( startsWith( "lexical", order ) )
            config.runOrder = RunTests::InLexicographicalOrder;
        else if( startsWith( "random", order ) )
            config.runOrder = RunTests::InRandomOrder;
        else
            throw std::runtime_error( "Unrecognised ordering: '" + order + '\'' );
    }